

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void OptimizeHuffmanForRle(int length,size_t *counts)

{
  bool bVar1;
  undefined1 auVar2 [16];
  void *__s;
  ulong uVar3;
  undefined4 *puVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  undefined4 *puVar11;
  ulong *puVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  
  puVar12 = counts + -1;
  if (length < 0) {
    __s = malloc((ulong)(uint)length << 2);
LAB_00102a5d:
    free(__s);
    return;
  }
  if (length != 0) {
    do {
      uVar7 = (ulong)(uint)length;
      if (puVar12[uVar7] != 0) {
        __s = malloc(uVar7 * 4);
        if (0 < length) {
          uVar13 = 0;
          memset(__s,0,uVar7 * 4);
          auVar2 = _DAT_00109340;
          auVar14 = _DAT_00109330;
          auVar17 = _DAT_00109320;
          uVar10 = *counts;
          puVar4 = (undefined4 *)((long)__s + -4);
          uVar9 = 0;
          uVar8 = uVar10;
          do {
            if ((uVar13 == uVar7) || (counts[uVar13] != uVar8)) {
              if ((uVar8 == 0 && 4 < (int)uVar9) || (6 < (int)uVar9 && uVar8 != 0)) {
                lVar6 = (ulong)uVar9 - 1;
                auVar16._8_4_ = (int)lVar6;
                auVar16._0_8_ = lVar6;
                auVar16._12_4_ = (int)((ulong)lVar6 >> 0x20);
                auVar16 = auVar16 ^ auVar2;
                uVar3 = 0;
                puVar11 = puVar4;
                auVar18 = auVar14;
                auVar19 = auVar17;
                do {
                  auVar21 = auVar18 ^ auVar2;
                  iVar15 = auVar16._4_4_;
                  if ((bool)(~(auVar21._4_4_ == iVar15 && auVar16._0_4_ < auVar21._0_4_ ||
                              iVar15 < auVar21._4_4_) & 1)) {
                    *puVar11 = 1;
                  }
                  if ((auVar21._12_4_ != auVar16._12_4_ || auVar21._8_4_ <= auVar16._8_4_) &&
                      auVar21._12_4_ <= auVar16._12_4_) {
                    *(undefined4 *)((long)__s + (uVar3 ^ 0x3ffffffffffffffe) * 4 + uVar13 * 4) = 1;
                  }
                  iVar20 = SUB164(auVar19 ^ auVar2,4);
                  if (iVar20 <= iVar15 &&
                      (iVar20 != iVar15 || SUB164(auVar19 ^ auVar2,0) <= auVar16._0_4_)) {
                    *(undefined4 *)((long)__s + (uVar3 ^ 0x3ffffffffffffffd) * 4 + uVar13 * 4) = 1;
                    *(undefined4 *)((long)__s + (uVar3 ^ 0x3ffffffffffffffc) * 4 + uVar13 * 4) = 1;
                  }
                  uVar3 = uVar3 + 4;
                  lVar6 = auVar18._8_8_;
                  auVar18._0_8_ = auVar18._0_8_ + 4;
                  auVar18._8_8_ = lVar6 + 4;
                  lVar6 = auVar19._8_8_;
                  auVar19._0_8_ = auVar19._0_8_ + 4;
                  auVar19._8_8_ = lVar6 + 4;
                  puVar11 = puVar11 + -4;
                } while ((uVar9 + 3 & 0xfffffffc) != uVar3);
              }
              uVar9 = 1;
              if (uVar13 != uVar7) {
                uVar8 = counts[uVar13];
              }
            }
            else {
              uVar9 = uVar9 + 1;
            }
            auVar18 = _DAT_00109330;
            uVar13 = uVar13 + 1;
            puVar4 = puVar4 + 1;
          } while (uVar13 != length + 1);
          uVar8 = 0;
          lVar6 = 0;
          uVar9 = 0;
          do {
            if ((uVar8 == uVar7) || (*(int *)((long)__s + uVar8 * 4) != 0)) {
LAB_00102ce7:
              if ((3 < (int)uVar9) || ((uVar9 == 3 && (lVar6 == 0)))) {
                uVar10 = ((ulong)(uVar9 >> 1) + lVar6) / (ulong)uVar9;
                uVar13 = uVar10 & 0xffffffff;
                if ((int)uVar10 < 2) {
                  uVar13 = 1;
                }
                if (lVar6 == 0) {
                  uVar13 = 0;
                }
                lVar6 = (ulong)uVar9 - 1;
                auVar14._8_4_ = (int)lVar6;
                auVar14._0_8_ = lVar6;
                auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
                uVar10 = 0;
                puVar5 = puVar12;
                auVar17 = auVar18;
                do {
                  bVar1 = SUB164(auVar14 ^ auVar2,0) < SUB164(auVar17 ^ auVar2,0);
                  iVar15 = SUB164(auVar14 ^ auVar2,4);
                  iVar20 = SUB164(auVar17 ^ auVar2,4);
                  if ((bool)(~(iVar15 < iVar20 || iVar20 == iVar15 && bVar1) & 1)) {
                    *puVar5 = uVar13;
                  }
                  if (iVar15 >= iVar20 && (iVar20 != iVar15 || !bVar1)) {
                    counts[uVar8 + (uVar10 ^ 0x1ffffffffffffffe)] = uVar13;
                  }
                  uVar10 = uVar10 + 2;
                  lVar6 = auVar17._8_8_;
                  auVar17._0_8_ = auVar17._0_8_ + 2;
                  auVar17._8_8_ = lVar6 + 2;
                  puVar5 = puVar5 + -2;
                } while ((uVar9 + 1 & 0xfffffffe) != uVar10);
              }
              if ((long)uVar8 < (long)(int)(length - 3)) {
                uVar10 = (counts + uVar8 + 2)[1] + (counts + uVar8)[1] +
                         counts[uVar8 + 2] + counts[uVar8] + 2 >> 2;
              }
              else if (uVar8 < uVar7) {
                uVar10 = counts[uVar8];
              }
              else {
                uVar10 = 0;
              }
              if (uVar8 != uVar7) {
                uVar13 = counts[uVar8];
                uVar9 = 1;
                lVar6 = 0;
                goto LAB_00102df8;
              }
              uVar9 = 1;
              lVar6 = 0;
            }
            else {
              uVar13 = counts[uVar8];
              uVar3 = uVar10 - uVar13;
              if (uVar10 < uVar13) {
                uVar3 = -(uVar10 - uVar13);
              }
              if (3 < uVar3) goto LAB_00102ce7;
              uVar9 = uVar9 + 1;
LAB_00102df8:
              lVar6 = lVar6 + uVar13;
            }
            uVar8 = uVar8 + 1;
            puVar12 = puVar12 + 1;
          } while (uVar8 != length + 1);
        }
        goto LAB_00102a5d;
      }
      length = length - 1;
    } while (length != 0);
  }
  return;
}

Assistant:

void OptimizeHuffmanForRle(int length, size_t* counts) {
  int i, k, stride;
  size_t symbol, sum, limit;
  int* good_for_rle;

  /* 1) We don't want to touch the trailing zeros. We may break the
  rules of the format by adding more data in the distance codes. */
  for (; length >= 0; --length) {
    if (length == 0) {
      return;
    }
    if (counts[length - 1] != 0) {
      /* Now counts[0..length - 1] does not have trailing zeros. */
      break;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
  with an rle code.*/
  good_for_rle = (int*)malloc((unsigned)length * sizeof(int));
  for (i = 0; i < length; ++i) good_for_rle[i] = 0;

  /* Let's not spoil any of the existing good rle codes.
  Mark any seq of 0's that is longer than 5 as a good_for_rle.
  Mark any seq of non-0's that is longer than 7 as a good_for_rle.*/
  symbol = counts[0];
  stride = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || counts[i] != symbol) {
      if ((symbol == 0 && stride >= 5) || (symbol != 0 && stride >= 7)) {
        for (k = 0; k < stride; ++k) {
          good_for_rle[i - k - 1] = 1;
        }
      }
      stride = 1;
      if (i != length) {
        symbol = counts[i];
      }
    } else {
      ++stride;
    }
  }

  /* 3) Let's replace those population counts that lead to more rle codes. */
  stride = 0;
  limit = counts[0];
  sum = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || good_for_rle[i]
        /* Heuristic for selecting the stride ranges to collapse. */
        || AbsDiff(counts[i], limit) >= 4) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        /* The stride must end, collapse what we have, if we have enough (4). */
        int count = (sum + stride / 2) / stride;
        if (count < 1) count = 1;
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
          that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 3) {
        /* All interesting strides have a count of at least 4,
        at least when non-zeros. */
        limit = (counts[i] + counts[i + 1] +
                 counts[i + 2] + counts[i + 3] + 2) / 4;
      } else if (i < length) {
        limit = counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
    }
  }

  free(good_for_rle);
}